

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmisc.c
# Opt level: O2

int quorem_D2A(Bigint *b,Bigint *S)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ULong *pUVar8;
  ULong *pUVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ULong *pUVar13;
  ULong *pUVar14;
  ulong uVar15;
  ULong *pUVar16;
  
  lVar7 = (long)S->wds;
  iVar6 = 0;
  if (S->wds <= b->wds) {
    pUVar16 = S->x;
    uVar15 = lVar7 - 1;
    pUVar13 = S->x + lVar7 + -1;
    pUVar14 = b->x;
    uVar2 = (ulong)b->x[lVar7 + -1] / (ulong)(*pUVar13 + 1);
    iVar6 = (int)uVar2;
    if (*pUVar13 + 1 <= b->x[lVar7 + -1]) {
      lVar5 = lVar7 * 4 + 0x14;
      lVar4 = 0;
      uVar10 = 0;
      pUVar8 = pUVar14;
      pUVar9 = pUVar16;
      do {
        uVar1 = *pUVar9;
        pUVar9 = pUVar9 + 1;
        uVar11 = uVar1 * uVar2 + uVar10;
        uVar10 = uVar11 >> 0x20;
        lVar12 = ((ulong)*pUVar8 - (uVar11 & 0xffffffff)) + lVar4;
        lVar4 = lVar12 >> 0x20;
        *pUVar8 = (uint)lVar12;
        pUVar8 = pUVar8 + 1;
      } while (pUVar9 <= pUVar13);
      if (b->x[lVar7 + -1] == 0) {
        for (; (0x1c < lVar5 && (*(int *)((long)b->x + lVar5 + -0x1c) == 0)); lVar5 = lVar5 + -4) {
          uVar15 = (ulong)((int)uVar15 - 1);
        }
        b->wds = (int)uVar15;
      }
    }
    iVar3 = cmp_D2A(b,S);
    if (-1 < iVar3) {
      lVar7 = 0;
      do {
        uVar1 = *pUVar16;
        pUVar16 = pUVar16 + 1;
        lVar5 = ((ulong)*pUVar14 - (ulong)uVar1) + lVar7;
        lVar7 = lVar5 >> 0x20;
        *pUVar14 = (uint)lVar5;
        pUVar14 = pUVar14 + 1;
      } while (pUVar16 <= pUVar13);
      iVar6 = iVar6 + 1;
      if (b->x[(int)uVar15] == 0) {
        for (lVar7 = (long)(int)uVar15 * 4 + 0x18;
            (0x1c < lVar7 && (*(int *)((long)b->x + lVar7 + -0x1c) == 0)); lVar7 = lVar7 + -4) {
          uVar15 = (ulong)((int)uVar15 - 1);
        }
        b->wds = (int)uVar15;
      }
    }
  }
  return iVar6;
}

Assistant:

int
quorem
#ifdef KR_headers
	(b, S) Bigint *b, *S;
#else
	(Bigint *b, Bigint *S)
#endif
{
	int n;
	ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
	ULLong borrow, carry, y, ys;
#else
	ULong borrow, carry, y, ys;
#ifdef Pack_32
	ULong si, z, zs;
#endif
#endif

	n = S->wds;
#ifdef DEBUG
	/*debug*/ if (b->wds > n)
	/*debug*/	Bug("oversize b in quorem");
#endif
	if (b->wds < n)
		return 0;
	sx = S->x;
	sxe = sx + --n;
	bx = b->x;
	bxe = bx + n;
	q = *bxe / (*sxe + 1);	/* ensure q <= true quotient */
#ifdef DEBUG
	/*debug*/ if (q > 9)
	/*debug*/	Bug("oversized quotient in quorem");
#endif
	if (q) {
		borrow = 0;
		carry = 0;
		do {
#ifdef ULLong
			ys = *sx++ * (ULLong)q + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) * q + carry;
			zs = (si >> 16) * q + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ * q + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		if (!*bxe) {
			bx = b->x;
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	if (cmp(b, S) >= 0) {
		q++;
		borrow = 0;
		carry = 0;
		bx = b->x;
		sx = S->x;
		do {
#ifdef ULLong
			ys = *sx++ + carry;
			carry = ys >> 32;
			y = *bx - (ys & 0xffffffffUL) - borrow;
			borrow = y >> 32 & 1UL;
			*bx++ = (ULong)(y & 0xffffffffUL);
#else
#ifdef Pack_32
			si = *sx++;
			ys = (si & 0xffff) + carry;
			zs = (si >> 16) + (ys >> 16);
			carry = zs >> 16;
			y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			z = (*bx >> 16) - (zs & 0xffff) - borrow;
			borrow = (z & 0x10000) >> 16;
			Storeinc(bx, z, y);
#else
			ys = *sx++ + carry;
			carry = ys >> 16;
			y = *bx - (ys & 0xffff) - borrow;
			borrow = (y & 0x10000) >> 16;
			*bx++ = y & 0xffff;
#endif
#endif
			}
			while(sx <= sxe);
		bx = b->x;
		bxe = bx + n;
		if (!*bxe) {
			while(--bxe > bx && !*bxe)
				--n;
			b->wds = n;
			}
		}
	return q;
	}